

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QRegion __thiscall QRegion::intersected(QRegion *this,QRegion *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QRegionPrivate *pQVar10;
  long lVar11;
  QRegionData *pQVar12;
  QRegion *in_RDX;
  QRegionPrivate *pQVar13;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = r->d->qt_rgn;
  if ((((pQVar13 != (QRegionPrivate *)0x0) && (iVar1 = pQVar13->numRects, iVar1 != 0)) &&
      (pQVar10 = in_RDX->d->qt_rgn, pQVar10 != (QRegionPrivate *)0x0)) && (pQVar10->numRects != 0))
  {
    iVar2 = (pQVar13->extents).x2.m_i;
    iVar3 = (pQVar10->extents).x1.m_i;
    if (iVar3 <= iVar2) {
      iVar4 = (pQVar13->extents).x1.m_i;
      iVar5 = (pQVar10->extents).x2.m_i;
      if (iVar4 <= iVar5) {
        iVar6 = (pQVar13->extents).y2.m_i;
        iVar7 = (pQVar10->extents).y1.m_i;
        if (iVar7 <= iVar6) {
          iVar8 = (pQVar13->extents).y1.m_i;
          iVar9 = (pQVar10->extents).y2.m_i;
          if (iVar8 <= iVar9) {
            if (((iVar4 < (pQVar10->innerRect).x1.m_i) || ((pQVar10->innerRect).x2.m_i < iVar2)) ||
               ((iVar8 < (pQVar10->innerRect).y1.m_i || ((pQVar10->innerRect).y2.m_i < iVar6)))) {
              if (((iVar3 < (pQVar13->innerRect).x1.m_i) || ((pQVar13->innerRect).x2.m_i < iVar5))
                 || ((iVar7 < (pQVar13->innerRect).y1.m_i || ((pQVar13->innerRect).y2.m_i < iVar9)))
                 ) {
                if (pQVar10->numRects == 1) {
                  if (iVar1 == 1) {
                    local_48 = qt_rect_intersect_normalized(&pQVar10->extents,&pQVar13->extents);
                    QRegion(this,&local_48,Rectangle);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      return (QRegion)(QRegionData *)this;
                    }
                    goto LAB_00429af9;
                  }
                  this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
                  QRegion(this,r);
                  detach(this);
                  pQVar13 = this->d->qt_rgn;
                  pQVar12 = in_RDX->d;
                }
                else {
                  this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
                  if (iVar1 != 1) {
                    QRegion(this);
                    detach(this);
                    miRegionOp(this->d->qt_rgn,r->d->qt_rgn,in_RDX->d->qt_rgn,miIntersectO,
                               (NonOverlapFunc)0x0,(NonOverlapFunc)0x0);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      miSetExtents(this->d->qt_rgn);
                      return (QRegion)(QRegionData *)this;
                    }
                    goto LAB_00429af9;
                  }
                  QRegion(this,in_RDX);
                  detach(this);
                  pQVar13 = this->d->qt_rgn;
                  pQVar12 = r->d;
                }
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  QRegionPrivate::intersect(pQVar13,&pQVar12->qt_rgn->extents);
                  return (QRegion)(QRegionData *)this;
                }
                goto LAB_00429af9;
              }
              lVar11 = *(long *)(in_FS_OFFSET + 0x28);
              r = in_RDX;
            }
            else {
              lVar11 = *(long *)(in_FS_OFFSET + 0x28);
            }
            if (lVar11 == local_38) {
              QRegion(this,r);
              return (QRegion)(QRegionData *)this;
            }
            goto LAB_00429af9;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QRegion(this);
    return (QRegion)(QRegionData *)this;
  }
LAB_00429af9:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::intersected(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn) || isEmptyHelper(r.d->qt_rgn)
        || !EXTENTCHECK(&d->qt_rgn->extents, &r.d->qt_rgn->extents))
        return QRegion();

    /* this is fully contained in r */
    if (r.d->qt_rgn->contains(*d->qt_rgn))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(*r.d->qt_rgn))
        return r;

    if (r.d->qt_rgn->numRects == 1 && d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(r.d->qt_rgn->extents,
                                                        d->qt_rgn->extents);
        return QRegion(rect);
    } else if (r.d->qt_rgn->numRects == 1) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->intersect(r.d->qt_rgn->extents);
        return result;
    } else if (d->qt_rgn->numRects == 1) {
        QRegion result(r);
        result.detach();
        result.d->qt_rgn->intersect(d->qt_rgn->extents);
        return result;
    }

    QRegion result;
    result.detach();
    miRegionOp(*result.d->qt_rgn, d->qt_rgn, r.d->qt_rgn, miIntersectO, nullptr, nullptr);

    /*
     * Can't alter dest's extents before we call miRegionOp because
     * it might be one of the source regions and miRegionOp depends
     * on the extents of those regions being the same. Besides, this
     * way there's no checking against rectangles that will be nuked
     * due to coalescing, so we have to examine fewer rectangles.
     */
    miSetExtents(*result.d->qt_rgn);
    return result;
}